

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintdevicewindow_p.h
# Opt level: O3

void __thiscall QPaintDeviceWindowPrivate::markWindowAsDirty(QPaintDeviceWindowPrivate *this)

{
  QRegionData *pQVar1;
  undefined8 uVar2;
  long in_FS_OFFSET;
  QRect local_30;
  QRegion local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (**(code **)(**(long **)&(this->super_QWindowPrivate).field_0x8 + 0x70))();
  local_30.x2.m_i = (int)uVar2 + -1;
  local_30.x1.m_i = 0;
  local_30.y1.m_i = 0;
  local_30.y2.m_i = (int)((ulong)uVar2 >> 0x20) + -1;
  QRegion::QRegion(&local_20,&local_30,Rectangle);
  pQVar1 = (this->dirtyRegion).d;
  (this->dirtyRegion).d = local_20.d;
  local_20.d = pQVar1;
  QRegion::~QRegion(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void markWindowAsDirty()
    {
        Q_Q(QPaintDeviceWindow);
        dirtyRegion = QRect(QPoint(0, 0), q->size());
    }